

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateAnimMesh.cpp
# Opt level: O0

aiAnimMesh * Assimp::aiCreateAnimMesh(aiMesh *mesh)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  aiAnimMesh *this;
  ulong uVar7;
  ulong uVar8;
  aiVector3D *paVar9;
  aiColor4D *paVar10;
  aiVector3t<float> *local_108;
  aiColor4t<float> *local_e0;
  aiVector3t<float> *local_b8;
  aiVector3t<float> *local_90;
  aiVector3t<float> *local_68;
  aiVector3t<float> *local_40;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  aiAnimMesh *animesh;
  aiMesh *mesh_local;
  
  this = (aiAnimMesh *)operator_new(0x4b0);
  aiAnimMesh::aiAnimMesh(this);
  this->mNumVertices = mesh->mNumVertices;
  if (mesh->mVertices != (aiVector3D *)0x0) {
    uVar7 = CONCAT44(0,this->mNumVertices);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar7;
    uVar8 = SUB168(auVar1 * ZEXT816(0xc),0);
    if (SUB168(auVar1 * ZEXT816(0xc),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    paVar9 = (aiVector3D *)operator_new__(uVar8);
    if (uVar7 != 0) {
      local_40 = paVar9;
      do {
        aiVector3t<float>::aiVector3t(local_40);
        local_40 = local_40 + 1;
      } while (local_40 != paVar9 + uVar7);
    }
    this->mVertices = paVar9;
    memcpy(this->mVertices,mesh->mVertices,(ulong)mesh->mNumVertices * 0xc);
  }
  if (mesh->mNormals != (aiVector3D *)0x0) {
    uVar7 = CONCAT44(0,this->mNumVertices);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar7;
    uVar8 = SUB168(auVar2 * ZEXT816(0xc),0);
    if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    paVar9 = (aiVector3D *)operator_new__(uVar8);
    if (uVar7 != 0) {
      local_68 = paVar9;
      do {
        aiVector3t<float>::aiVector3t(local_68);
        local_68 = local_68 + 1;
      } while (local_68 != paVar9 + uVar7);
    }
    this->mNormals = paVar9;
    memcpy(this->mNormals,mesh->mNormals,(ulong)mesh->mNumVertices * 0xc);
  }
  if (mesh->mTangents != (aiVector3D *)0x0) {
    uVar7 = CONCAT44(0,this->mNumVertices);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar7;
    uVar8 = SUB168(auVar3 * ZEXT816(0xc),0);
    if (SUB168(auVar3 * ZEXT816(0xc),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    paVar9 = (aiVector3D *)operator_new__(uVar8);
    if (uVar7 != 0) {
      local_90 = paVar9;
      do {
        aiVector3t<float>::aiVector3t(local_90);
        local_90 = local_90 + 1;
      } while (local_90 != paVar9 + uVar7);
    }
    this->mTangents = paVar9;
    memcpy(this->mTangents,mesh->mTangents,(ulong)mesh->mNumVertices * 0xc);
  }
  if (mesh->mBitangents != (aiVector3D *)0x0) {
    uVar7 = CONCAT44(0,this->mNumVertices);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar7;
    uVar8 = SUB168(auVar4 * ZEXT816(0xc),0);
    if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    paVar9 = (aiVector3D *)operator_new__(uVar8);
    if (uVar7 != 0) {
      local_b8 = paVar9;
      do {
        aiVector3t<float>::aiVector3t(local_b8);
        local_b8 = local_b8 + 1;
      } while (local_b8 != paVar9 + uVar7);
    }
    this->mBitangents = paVar9;
    memcpy(this->mBitangents,mesh->mBitangents,(ulong)mesh->mNumVertices * 0xc);
  }
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    if (mesh->mColors[local_1c] == (aiColor4D *)0x0) {
      this->mColors[local_1c] = (aiColor4D *)0x0;
    }
    else {
      uVar7 = CONCAT44(0,this->mNumVertices);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar7;
      uVar8 = SUB168(auVar5 * ZEXT816(0x10),0);
      if (SUB168(auVar5 * ZEXT816(0x10),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      paVar10 = (aiColor4D *)operator_new__(uVar8);
      if (uVar7 != 0) {
        local_e0 = paVar10;
        do {
          aiColor4t<float>::aiColor4t(local_e0);
          local_e0 = local_e0 + 1;
        } while (local_e0 != paVar10 + uVar7);
      }
      this->mColors[local_1c] = paVar10;
      memcpy(this->mColors[local_1c],mesh->mColors[local_1c],(ulong)mesh->mNumVertices << 4);
    }
  }
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    if (mesh->mTextureCoords[local_20] == (aiVector3D *)0x0) {
      this->mTextureCoords[local_20] = (aiVector3D *)0x0;
    }
    else {
      uVar7 = CONCAT44(0,this->mNumVertices);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar7;
      uVar8 = SUB168(auVar6 * ZEXT816(0xc),0);
      if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
        uVar8 = 0xffffffffffffffff;
      }
      paVar9 = (aiVector3D *)operator_new__(uVar8);
      if (uVar7 != 0) {
        local_108 = paVar9;
        do {
          aiVector3t<float>::aiVector3t(local_108);
          local_108 = local_108 + 1;
        } while (local_108 != paVar9 + uVar7);
      }
      this->mTextureCoords[local_20] = paVar9;
      memcpy(this->mTextureCoords[local_20],mesh->mTextureCoords[local_20],
             (ulong)mesh->mNumVertices * 0xc);
    }
  }
  return this;
}

Assistant:

aiAnimMesh *aiCreateAnimMesh(const aiMesh *mesh)
{
    aiAnimMesh *animesh = new aiAnimMesh;
    animesh->mNumVertices = mesh->mNumVertices;
    if (mesh->mVertices) {
        animesh->mVertices = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mVertices, mesh->mVertices, mesh->mNumVertices * sizeof(aiVector3D));
    }
    if (mesh->mNormals) {
        animesh->mNormals = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mNormals, mesh->mNormals, mesh->mNumVertices * sizeof(aiVector3D));
    }
    if (mesh->mTangents) {
        animesh->mTangents = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mTangents, mesh->mTangents, mesh->mNumVertices * sizeof(aiVector3D));
    }
    if (mesh->mBitangents) {
        animesh->mBitangents = new aiVector3D[animesh->mNumVertices];
        std::memcpy(animesh->mBitangents, mesh->mBitangents, mesh->mNumVertices * sizeof(aiVector3D));
    }

    for (int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
        if (mesh->mColors[i]) {
            animesh->mColors[i] = new aiColor4D[animesh->mNumVertices];
            std::memcpy(animesh->mColors[i], mesh->mColors[i], mesh->mNumVertices * sizeof(aiColor4D));
        } else {
            animesh->mColors[i] = NULL;
        }
    }

    for (int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
        if (mesh->mTextureCoords[i]) {
            animesh->mTextureCoords[i] = new aiVector3D[animesh->mNumVertices];
            std::memcpy(animesh->mTextureCoords[i], mesh->mTextureCoords[i], mesh->mNumVertices * sizeof(aiVector3D));
        } else {
            animesh->mTextureCoords[i] = NULL;
        }
    }
    return animesh;
}